

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O2

void * mpp_enc_thread(void *data)

{
  MppTask *task;
  MppFrame *frame;
  MppPacket *packet;
  MppBuffer *ppvVar1;
  RK_S32 *pRVar2;
  MppEncImpl *enc;
  MppThread *this;
  MppEncImpl *pMVar3;
  Mpp *mpp;
  EncImpl pvVar4;
  MppEnc pvVar5;
  RK_U8 *pRVar6;
  ushort uVar7;
  MppThreadStatus MVar8;
  MPP_RET MVar9;
  RK_U32 RVar10;
  RK_S64 RVar11;
  MppEncRefFrmUsrCfg *cfg;
  MppStopwatch stopwatch;
  MppBuffer pvVar12;
  size_t sVar13;
  void *pvVar14;
  byte bVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  MppTask task_00;
  uint uVar19;
  MppPacket pvVar20;
  undefined8 uVar21;
  EncAsyncStatus EVar22;
  MppEncHal hal;
  ulong uVar23;
  RK_U8 *pRVar24;
  bool bVar25;
  bool bVar26;
  void *in_stack_fffffffffffffcb8;
  undefined8 uVar27;
  undefined4 uVar28;
  size_t in_stack_fffffffffffffcc0;
  uint local_314;
  AutoMutex autolock;
  EncAsyncTaskInfo local_2c0;
  EncImpl local_88;
  MppEncHal local_80;
  pthread_mutex_t *local_78;
  MppEncRefFrmUsrCfg *local_70;
  MppBuffer *local_68;
  MppTask *local_60;
  EncRcTaskInfo *local_58;
  sem_t *local_50;
  pthread_mutex_t *local_48;
  sem_t *local_40;
  sem_t *local_38;
  
  enc = *(MppEncImpl **)((long)data + 0xb0);
  this = enc->thread_enc;
  memset(&local_2c0,0,0x238);
  RVar11 = mpp_time();
  enc->time_base = RVar11;
  local_78 = (pthread_mutex_t *)this->mMutexCond;
  local_38 = (sem_t *)&enc->cmd_start;
  local_40 = (sem_t *)&enc->cmd_done;
  local_70 = &enc->frm_cfg;
  local_48 = (pthread_mutex_t *)(this->mMutexCond + 3);
  local_50 = (sem_t *)&enc->enc_reset;
  cfg = &local_2c0.usr;
  task = &enc->task_in;
  local_60 = &enc->task_out;
  frame = &enc->frame;
  packet = &enc->packet;
  local_68 = &enc->md_info;
  ppvVar1 = &enc->frm_buf;
  local_58 = &enc->rc_info_prev;
  local_314 = 0;
LAB_0013d80f:
  do {
    autolock.mEnabled = 1;
    autolock.mLock = (Mutex *)&local_78->__data;
    pthread_mutex_lock(local_78);
    MVar8 = MppThread::get_status(this,THREAD_WORK);
    if (MVar8 != MPP_THREAD_RUNNING) {
      Mutex::Autolock::~Autolock(&autolock);
      release_task_in_port(enc->input);
      release_task_in_port(*(MppPort *)((long)data + 0x58));
      return (void *)0x0;
    }
    uVar19 = enc->notify_flag;
    RVar10 = 0;
    bVar26 = true;
    if (enc->reset_flag == 0) {
      if ((uVar19 & 0x10) != 0) {
        RVar10 = uVar19 & 0xffffffef;
        goto LAB_0013d884;
      }
      bVar25 = (uVar19 & local_314) != 0;
      bVar26 = bVar25 || (short)local_314 == 0;
      pcVar17 = "wait";
      if (bVar25 || (short)local_314 == 0) {
        pcVar17 = "work";
      }
    }
    else {
LAB_0013d884:
      pcVar17 = "work";
    }
    if ((mpp_enc_debug & 0x10) != 0) {
      in_stack_fffffffffffffcc0 =
           CONCAT44((int)(in_stack_fffffffffffffcc0 >> 0x20),~local_314 & enc->status_flag);
      in_stack_fffffffffffffcb8 =
           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),local_314);
      _mpp_log_l(4,"mpp_enc","%p %08x -> %08x [%08x] notify %08x -> %s\n","check_enc_task_wait",enc,
                 (ulong)enc->status_flag,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0,uVar19,
                 pcVar17);
    }
    enc->status_flag = local_314;
    enc->notify_flag = RVar10;
    if (bVar26) {
      enc->work_count = enc->work_count + 1;
    }
    else {
      enc->wait_count = enc->wait_count + 1;
      MppThread::wait(this,(void *)0x0);
    }
    Mutex::Autolock::~Autolock(&autolock);
    if ((local_2c0.status.val >> 8 & 1) != 0) {
LAB_0013e6d5:
      if ((local_2c0.status.val >> 8 & 1) == 0) {
        in_stack_fffffffffffffcb8 =
             (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0xa89);
        _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"status->enc_start",
                   "mpp_enc_thread",in_stack_fffffffffffffcb8);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00140587:
          abort();
        }
        if ((local_2c0.status.val >> 8 & 1) == 0) goto LAB_0013d80f;
      }
      pvVar20 = local_2c0.task.packet;
      if (enc->low_delay_part_mode == 0) {
        bVar26 = true;
        if (local_2c0.task.flags.drop_by_fps == 0) {
          mpp = (Mpp *)enc->mpp;
          pMVar3 = (MppEncImpl *)mpp->mEnc;
          pvVar4 = pMVar3->impl;
          pvVar14 = pMVar3->enc_hal;
          if ((pMVar3->support_hw_deflicker == 0) || ((pMVar3->cfg).rc.debreath_en == 0)) {
LAB_0013e7d4:
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d check force pskip start\n","mpp_enc_normal",
                         local_2c0.rc.frm.val >> 0x30);
            }
            if ((local_2c0.status.val & 0x40) == 0) {
              local_2c0.status.val = local_2c0.status.val | 0x40;
              mpp_enc_get_pskip_mode((Mpp *)pMVar3->mpp,&local_2c0,(MppPskipMode *)&autolock);
              if (autolock._4_4_ == 0 && autolock.mEnabled == 0) goto LAB_0013e878;
              MVar9 = mpp_enc_force_pskip((Mpp *)pMVar3->mpp,&local_2c0);
              if (MVar9 != MPP_OK) {
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","mpp_enc_normal",
                             local_2c0.rc.frm.val >> 0x30);
                }
                goto LAB_0013e878;
              }
LAB_0013f501:
              bVar26 = true;
              while( true ) {
                if (((local_2c0.rc.frm.val >> 0x22 & 1) == 0) ||
                   ((enc->cfg).rc.max_reenc_times <=
                    ((uint)((ulong)local_2c0.rc.frm >> 0x28) & 0xff))) goto LAB_0013fba8;
                local_2c0.task.length = local_2c0.task.length - local_2c0.task.hw_length;
                local_2c0.task.hw_length = 0;
                mpp_packet_set_segment_nb(local_2c0.task.packet,local_2c0.task.segment_nb);
                if ((mpp_enc_debug & 0x20) != 0) {
                  uVar19 = (uint)((ulong)local_2c0.rc.frm >> 0x20);
                  in_stack_fffffffffffffcb8 =
                       (void *)(CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),uVar19 >> 8
                                        ) & 0xffffffff000000ff);
                  _mpp_log_l(4,"mpp_enc","task %d reenc %d times %d\n","try_proc_normal_task",
                             local_2c0.rc.frm.val >> 0x30,(ulong)(uVar19 >> 2 & 1),
                             in_stack_fffffffffffffcb8);
                }
                if ((local_2c0.rc.frm.val & 0x100000000) != 0) break;
                if ((local_2c0.rc.frm.val & 0x10000000a0) == 0x1000000000) {
                  pvVar5 = mpp->mEnc;
                  pvVar4 = *(EncImpl *)((long)pvVar5 + 8);
                  if ((mpp_enc_debug & 1) != 0) {
                    _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_force_pskip");
                  }
                  local_2c0.usr.force_pskip = local_2c0.usr.force_pskip + 1;
                  local_2c0.usr.force_flag = local_2c0.usr.force_flag | 0x40;
                  mpp_enc_refs_rollback(*(MppEncRefs *)((long)pvVar5 + 0x210));
                  mpp_enc_refs_set_usr_cfg(*(MppEncRefs *)((long)pvVar5 + 0x210),cfg);
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_reenc_force_pskip",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  mpp_enc_refs_get_cpb(*(MppEncRefs *)((long)pvVar5 + 0x210),&local_2c0.rc.cpb);
                  if ((mpp_enc_debug & 0x10000) != 0) {
                    _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                               "mpp_enc_reenc_force_pskip",
                               (ulong)(ushort)local_2c0.rc.cpb.curr.val._6_2_);
                  }
                  MVar9 = enc_impl_proc_dpb(pvVar4,&local_2c0.task);
                  if (MVar9 == MPP_OK) {
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d enc sw enc start\n",
                                 "mpp_enc_reenc_force_pskip",local_2c0.rc.frm.val >> 0x30);
                    }
                    MVar9 = enc_impl_sw_enc(pvVar4,&local_2c0.task);
                    if (MVar9 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                      pcVar17 = "mpp %p enc_impl_sw_enc:%-4d failed return %d";
                      uVar21 = 0x805;
                      goto LAB_0013fdcf;
                    }
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","mpp_enc_reenc_force_pskip",
                                 local_2c0.rc.frm.val >> 0x30);
                    }
                    MVar9 = rc_frm_end(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c0.rc);
                    if (MVar9 != MPP_OK) {
                      in_stack_fffffffffffffcb8 =
                           (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                      _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0,
                                 mpp,0x808,in_stack_fffffffffffffcb8);
                    }
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
                    uVar21 = 0x802;
LAB_0013fdcf:
                    _mpp_log_l(2,"mpp_enc",pcVar17,(char *)0x0,mpp,uVar21,in_stack_fffffffffffffcb8)
                    ;
                  }
                  pcVar17 = "mpp_enc_reenc_force_pskip";
                  goto joined_r0x0013fb92;
                }
                local_2c0.rc.frm.val = local_2c0.rc.frm.val & 0xffffffeeffffffff;
                pvVar5 = mpp->mEnc;
                pvVar14 = *(void **)((long)pvVar5 + 0x10);
                if ((mpp_enc_debug & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_simple");
                }
                local_2c0.rc.info.reserve[0] = 0;
                local_2c0.rc.info.reserve[1] = 0;
                local_2c0.rc.info.reserve[2] = 0;
                local_2c0.rc.info.reserve[3] = 0;
                local_2c0.rc.info.complex_scene = 0;
                local_2c0.rc.info.scene_mode = 0;
                local_2c0.rc.info.last_scene_mode = 0;
                local_2c0.rc.info.rt_bits = 0;
                local_2c0.rc.info.lvl8_intra_num = 0;
                local_2c0.rc.info.lvl4_intra_num = 0;
                local_2c0.rc.info.motion_level = 0;
                local_2c0.rc.info.complex_level = 0;
                local_2c0.rc.info.lvl16_inter_num = 0;
                local_2c0.rc.info.lvl8_inter_num = 0;
                local_2c0.rc.info.lvl32_intra_num = 0;
                local_2c0.rc.info.lvl16_intra_num = 0;
                local_2c0.rc.info.sse = 0;
                local_2c0.rc.info.lvl64_inter_num = 0;
                local_2c0.rc.info.lvl32_inter_num = 0;
                local_2c0.rc.info.madi = 0;
                local_2c0.rc.info.madp = 0;
                local_2c0.rc.info.iblk4_prop = 0;
                local_2c0.rc.info._52_4_ = 0;
                local_2c0.rc.info.bit_real = 0;
                local_2c0.rc.info.quality_real = 0;
                local_2c0.rc.info._8_8_ = local_2c0.rc.info._8_8_ & 0xffffffff00000000;
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_reenc_simple",
                             local_2c0.rc.frm.val >> 0x30);
                }
                MVar9 = enc_impl_proc_hal(*(EncImpl *)((long)pvVar5 + 8),&local_2c0.task);
                if (MVar9 == MPP_OK) {
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = mpp_enc_hal_get_task(pvVar14,&local_2c0.task);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                    uVar21 = 0x7b4;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = rc_hal_start(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c0.rc);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p rc_hal_start:%-4d failed return %d";
                    uVar21 = 0x7b7;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = mpp_enc_hal_gen_regs(pvVar14,&local_2c0.task);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                    uVar21 = 0x7ba;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = mpp_enc_hal_start(pvVar14,&local_2c0.task);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                    uVar21 = 0x7bd;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = mpp_enc_hal_wait(pvVar14,&local_2c0.task);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                    uVar21 = 0x7c0;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = rc_hal_end(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c0.rc);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p rc_hal_end:%-4d failed return %d";
                    uVar21 = 0x7c3;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = mpp_enc_hal_ret_task(pvVar14,&local_2c0.task);
                  if (MVar9 != MPP_OK) {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                    uVar21 = 0x7c6;
                    goto LAB_0013f9ba;
                  }
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc frame check reenc\n","mpp_enc_reenc_simple",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = rc_frm_check_reenc(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c0.rc);
                  uVar28 = (undefined4)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
                  if (MVar9 == MPP_OK) {
                    if ((mpp_enc_debug & 0x20) != 0) {
                      uVar19 = (uint)((ulong)local_2c0.rc.frm >> 0x20);
                      in_stack_fffffffffffffcb8 =
                           (void *)(CONCAT44(uVar28,uVar19 >> 8) & 0xffffffff000000ff);
                      _mpp_log_l(4,"mpp_enc","task %d reenc %d times %d\n","mpp_enc_reenc_simple",
                                 local_2c0.rc.frm.val >> 0x30,(ulong)(uVar19 >> 2 & 1),
                                 in_stack_fffffffffffffcb8);
                    }
                    if ((mpp_enc_debug & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","leave\n","mpp_enc_reenc_simple");
                    }
                  }
                  else {
                    in_stack_fffffffffffffcb8 = (void *)CONCAT44(uVar28,MVar9);
                    _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_check_reenc:%-4d failed return %d",
                               (char *)0x0,mpp,0x7c9,in_stack_fffffffffffffcb8);
                  }
                }
                else {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                  pcVar17 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                  uVar21 = 0x7b1;
LAB_0013f9ba:
                  _mpp_log_l(2,"mpp_enc",pcVar17,(char *)0x0,mpp,uVar21,in_stack_fffffffffffffcb8);
                }
              }
              pvVar5 = mpp->mEnc;
              if ((mpp_enc_debug & 1) != 0) {
                _mpp_log_l(4,"mpp_enc","enter\n","mpp_enc_reenc_drop");
              }
              mpp_enc_refs_rollback(*(MppEncRefs *)((long)pvVar5 + 0x210));
              local_2c0.rc.info.quality_real = local_2c0.rc.info.quality_target;
              local_2c0.rc.info.bit_real = local_2c0.task.length;
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","mpp_enc_reenc_drop",
                           local_2c0.rc.frm.val >> 0x30);
              }
              MVar9 = rc_frm_end(*(RcCtx *)((long)pvVar5 + 0x60),&local_2c0.rc);
              if (MVar9 != MPP_OK) {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0,mpp,
                           0x7e2,in_stack_fffffffffffffcb8);
              }
              pcVar17 = "mpp_enc_reenc_drop";
joined_r0x0013fb92:
              if ((mpp_enc_debug & 1) != 0) {
                _mpp_log_l(4,"mpp_enc","leave\n",pcVar17);
              }
LAB_0013fba8:
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc frame end\n","try_proc_normal_task",
                           local_2c0.rc.frm.val >> 0x30);
              }
              MVar9 = rc_frm_end(enc->rc_ctx,&local_2c0.rc);
              if (MVar9 == MPP_OK) {
                RVar11 = mpp_time();
                enc->time_end = RVar11;
                enc->frame_count = enc->frame_count + 1;
                if (((enc->dev != (MppDev)0x0) && (enc->time_base != 0)) &&
                   ((RVar11 != 0 && (999999 < RVar11 - enc->time_base)))) {
                  update_hal_info_fps(enc);
                }
                local_2c0.rc.frm.val = local_2c0.rc.frm.val & 0xffff00fbffffffff;
                local_2c0.usr.force_flag = 0;
              }
              else {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                bVar26 = false;
                _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_end:%-4d failed return %d",(char *)0x0,mpp,
                           0xa09,in_stack_fffffffffffffcb8);
              }
              goto LAB_0013f36d;
            }
LAB_0013e878:
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_normal",
                         local_2c0.rc.frm.val >> 0x30);
            }
            mpp_enc_refs_get_cpb(pMVar3->refs,&local_2c0.rc.cpb);
            if ((mpp_enc_debug & 0x10000) != 0) {
              _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                         "mpp_enc_normal",(ulong)(ushort)local_2c0.rc.cpb.curr.val._6_2_);
            }
            MVar9 = enc_impl_proc_dpb(pvVar4,&local_2c0.task);
            if (MVar9 == MPP_OK) {
              if ((((mpp_enc_debug >> 0x10 & 1) != 0) &&
                  (_mpp_log_l(4,"mpp_enc","frm %d compare\n","mpp_enc_normal",
                              (ulong)(ushort)local_2c0.rc.cpb.curr.val._6_2_),
                  (mpp_enc_debug >> 0x10 & 1) != 0)) &&
                 (_mpp_log_l(4,"mpp_enc","seq_idx      %d vs %d\n","mpp_enc_normal",
                             local_2c0.rc.frm.val >> 0x30,
                             (ulong)(ushort)local_2c0.rc.cpb.curr.val._6_2_),
                 (mpp_enc_debug >> 0x10 & 1) != 0)) {
                _mpp_log_l(4,"mpp_enc","is_idr       %d vs %d\n","mpp_enc_normal",
                           (ulong)((uint)local_2c0.rc.frm.val._0_4_ >> 5 & 1),
                           (ulong)((uint)local_2c0.rc.cpb.curr.val._0_4_ >> 5 & 1));
                if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                  _mpp_log_l(4,"mpp_enc","is_intra     %d vs %d\n","mpp_enc_normal",
                             (ulong)((uint)local_2c0.rc.frm.val._0_4_ >> 4 & 1),
                             (ulong)((uint)local_2c0.rc.cpb.curr.val._0_4_ >> 4 & 1));
                  if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                    _mpp_log_l(4,"mpp_enc","is_non_ref   %d vs %d\n","mpp_enc_normal",
                               (ulong)((uint)local_2c0.rc.frm.val._0_4_ >> 6 & 1),
                               (ulong)((uint)local_2c0.rc.cpb.curr.val._0_4_ >> 6 & 1));
                    if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                      _mpp_log_l(4,"mpp_enc","is_lt_ref    %d vs %d\n","mpp_enc_normal",
                                 (ulong)((uint)local_2c0.rc.frm.val._0_4_ >> 7 & 1),
                                 (ulong)((uint)local_2c0.rc.cpb.curr.val._0_4_ >> 7 & 1));
                      if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                        _mpp_log_l(4,"mpp_enc","lt_idx       %d vs %d\n","mpp_enc_normal",
                                   (ulong)((uint)local_2c0.rc.frm.val._0_4_ >> 8 & 0xf),
                                   (ulong)((uint)local_2c0.rc.cpb.curr.val._0_4_ >> 8 & 0xf));
                        if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                          _mpp_log_l(4,"mpp_enc","temporal_id  %d vs %d\n","mpp_enc_normal",
                                     (ulong)((uint)local_2c0.rc.frm.val._0_4_ >> 0xc & 0xf),
                                     (ulong)((uint)local_2c0.rc.cpb.curr.val._0_4_ >> 0xc & 0xf));
                          if ((mpp_enc_debug >> 0x10 & 1) != 0) {
                            _mpp_log_l(4,"mpp_enc",
                                       "frm %d done  ***********************************\n",
                                       "mpp_enc_normal",
                                       (ulong)(ushort)local_2c0.rc.cpb.curr.val._6_2_);
                          }
                        }
                      }
                    }
                  }
                }
              }
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","mpp_enc_normal",
                           local_2c0.rc.frm.val >> 0x30);
              }
              MVar9 = rc_frm_start(pMVar3->rc_ctx,&local_2c0.rc);
              if (MVar9 == MPP_OK) {
                mpp_enc_add_sw_header(pMVar3,&local_2c0.task);
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_normal",
                             local_2c0.rc.frm.val >> 0x30);
                }
                MVar9 = enc_impl_proc_hal(pvVar4,&local_2c0.task);
                if (MVar9 == MPP_OK) {
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_normal",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = mpp_enc_hal_get_task(pvVar14,&local_2c0.task);
                  if (MVar9 == MPP_OK) {
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","mpp_enc_normal",
                                 local_2c0.rc.frm.val >> 0x30);
                    }
                    MVar9 = rc_hal_start(pMVar3->rc_ctx,&local_2c0.rc);
                    if (MVar9 == MPP_OK) {
                      if ((mpp_enc_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_normal",
                                   local_2c0.rc.frm.val >> 0x30);
                      }
                      MVar9 = mpp_enc_hal_gen_regs(pvVar14,&local_2c0.task);
                      if (MVar9 == MPP_OK) {
                        local_2c0.task.segment_nb = mpp_packet_get_segment_nb(local_2c0.task.packet)
                        ;
                        mpp_stopwatch_record(local_2c0.task.stopwatch,"encode hal start");
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_normal",
                                     local_2c0.rc.frm.val >> 0x30);
                        }
                        MVar9 = mpp_enc_hal_start(pvVar14,&local_2c0.task);
                        if (MVar9 == MPP_OK) {
                          if ((mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_normal",
                                       local_2c0.rc.frm.val >> 0x30);
                          }
                          MVar9 = mpp_enc_hal_wait(pvVar14,&local_2c0.task);
                          if (MVar9 == MPP_OK) {
                            mpp_stopwatch_record(local_2c0.task.stopwatch,"encode hal finish");
                            if ((mpp_enc_debug & 0x20) != 0) {
                              _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","mpp_enc_normal",
                                         local_2c0.rc.frm.val >> 0x30);
                            }
                            MVar9 = rc_hal_end(pMVar3->rc_ctx,&local_2c0.rc);
                            if (MVar9 == MPP_OK) {
                              if ((mpp_enc_debug & 0x20) != 0) {
                                _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_normal",
                                           local_2c0.rc.frm.val >> 0x30);
                              }
                              MVar9 = mpp_enc_hal_ret_task(pvVar14,&local_2c0.task);
                              if (MVar9 == MPP_OK) {
                                if ((mpp_enc_debug & 0x20) != 0) {
                                  _mpp_log_l(4,"mpp_enc","task %d rc frame check reenc\n",
                                             "mpp_enc_normal",local_2c0.rc.frm.val >> 0x30);
                                }
                                MVar9 = rc_frm_check_reenc(pMVar3->rc_ctx,&local_2c0.rc);
                                if (MVar9 == MPP_OK) goto LAB_0013f501;
                                uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar9);
                                pcVar17 = "mpp %p rc_frm_check_reenc:%-4d failed return %d";
                                uVar21 = 0x78d;
                              }
                              else {
                                uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  MVar9);
                                pcVar17 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                                uVar21 = 0x78a;
                              }
                            }
                            else {
                              uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar9);
                              pcVar17 = "mpp %p rc_hal_end:%-4d failed return %d";
                              uVar21 = 0x787;
                            }
                          }
                          else {
                            uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9)
                            ;
                            pcVar17 = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                            uVar21 = 0x782;
                          }
                        }
                        else {
                          uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                          pcVar17 = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
                          uVar21 = 0x77f;
                        }
                      }
                      else {
                        uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                        pcVar17 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                        uVar21 = 0x77a;
                      }
                    }
                    else {
                      uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                      pcVar17 = "mpp %p rc_hal_start:%-4d failed return %d";
                      uVar21 = 0x777;
                    }
                  }
                  else {
                    uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                    uVar21 = 0x774;
                  }
                }
                else {
                  uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                  pcVar17 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                  uVar21 = 0x771;
                }
              }
              else {
                uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                pcVar17 = "mpp %p rc_frm_start:%-4d failed return %d";
                uVar21 = 0x76b;
              }
            }
            else {
              uVar27 = CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
              pcVar17 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
              uVar21 = 0x75e;
            }
            _mpp_log_l(2,"mpp_enc",pcVar17,(char *)0x0,mpp,uVar21,uVar27);
            uVar28 = (undefined4)((ulong)uVar27 >> 0x20);
          }
          else {
            MVar9 = mpp_enc_proc_two_pass(mpp,&local_2c0);
            uVar28 = (undefined4)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
            if (MVar9 == MPP_OK) goto LAB_0013e7d4;
          }
          in_stack_fffffffffffffcb8 = (void *)CONCAT44(uVar28,MVar9);
          bVar26 = false;
          _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_normal:%-4d failed return %d",(char *)0x0,mpp,0x9f1
                     ,in_stack_fffffffffffffcb8);
        }
LAB_0013f36d:
        mpp_stopwatch_record(local_2c0.task.stopwatch,"encode task done");
        RVar10 = mpp_packet_is_partition(pvVar20);
        if (RVar10 == 0) {
          mpp_packet_set_length(pvVar20,(ulong)local_2c0.task.length);
        }
        if (bVar26) {
          set_enc_info_to_packet(enc,&local_2c0.task);
        }
        else {
          *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
          (enc->hdr_status).val = 0;
          mpp_packet_set_length(pvVar20,0);
          _mpp_log_l(2,"mpp_enc","enc failed force idr!\n","try_proc_normal_task");
        }
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","try_proc_normal_task",
                     local_2c0.rc.frm.val >> 0x30,enc->task_pts);
        }
        mpp_task_meta_set_packet(enc->task_out,KEY_OUTPUT_PACKET,pvVar20);
        _mpp_port_enqueue("try_proc_normal_task",enc->output,enc->task_out);
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","try_proc_normal_task",
                     local_2c0.rc.frm.val >> 0x30,enc->task_pts);
        }
        mpp_task_meta_set_frame(enc->task_in,KEY_INPUT_FRAME,enc->frame);
        _mpp_port_enqueue("try_proc_normal_task",enc->input,enc->task_in);
        if ((enc->support_hw_deflicker != 0) && ((enc->cfg).rc.debreath_en != 0)) {
          memcpy(local_58,&local_2c0.rc.info,0x88);
        }
LAB_0013f4cd:
        enc->frame = (MppFrame)0x0;
        enc->packet = (MppPacket)0x0;
        *task = (MppTask)0x0;
        enc->task_out = (MppTask)0x0;
        *ppvVar1 = (MppBuffer)0x0;
        enc->pkt_buf = (MppBuffer)0x0;
        (enc->hdr_status).val = *(byte *)&enc->hdr_status & 1;
        local_2c0.status.val = 0;
      }
      else {
        pMVar3 = *(MppEncImpl **)((long)data + 0xb0);
        if (local_2c0.task.flags.drop_by_fps == 0) {
          local_80 = pMVar3->enc_hal;
          if ((local_2c0.status.val >> 10 & 1) != 0) goto LAB_001402f0;
          local_88 = pMVar3->impl;
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d check force pskip start\n","try_proc_low_deley_task",
                       local_2c0.rc.frm.val >> 0x30);
          }
          if ((local_2c0.status.val & 0x40) == 0) {
            local_2c0.status.val = local_2c0.status.val | 0x40;
            mpp_enc_get_pskip_mode((Mpp *)pMVar3->mpp,&local_2c0,(MppPskipMode *)&autolock);
            if (autolock._4_4_ != 0 || autolock.mEnabled != 0) {
              MVar9 = mpp_enc_force_pskip((Mpp *)pMVar3->mpp,&local_2c0);
              if (MVar9 == MPP_OK) goto LAB_0013ff89;
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d set force pskip failed.","try_proc_low_deley_task",
                           local_2c0.rc.frm.val >> 0x30);
              }
            }
          }
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","try_proc_low_deley_task",
                       local_2c0.rc.frm.val >> 0x30);
          }
          mpp_enc_refs_get_cpb(pMVar3->refs,&local_2c0.rc.cpb);
          hal = local_80;
          if ((mpp_enc_debug & 0x10000) != 0) {
            _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                       "try_proc_low_deley_task",(ulong)(ushort)local_2c0.rc.cpb.curr.val._6_2_);
          }
          MVar9 = enc_impl_proc_dpb(local_88,&local_2c0.task);
          if (MVar9 == MPP_OK) {
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d rc frame start\n","try_proc_low_deley_task",
                         local_2c0.rc.frm.val >> 0x30);
            }
            MVar9 = rc_frm_start(pMVar3->rc_ctx,&local_2c0.rc);
            if (MVar9 == MPP_OK) {
              mpp_enc_add_sw_header(pMVar3,&local_2c0.task);
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","try_proc_low_deley_task",
                           local_2c0.rc.frm.val >> 0x30);
              }
              MVar9 = enc_impl_proc_hal(local_88,&local_2c0.task);
              if (MVar9 == MPP_OK) {
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d hal get task\n","try_proc_low_deley_task",
                             local_2c0.rc.frm.val >> 0x30);
                }
                MVar9 = mpp_enc_hal_get_task(hal,&local_2c0.task);
                if (MVar9 == MPP_OK) {
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d rc hal start\n","try_proc_low_deley_task",
                               local_2c0.rc.frm.val >> 0x30);
                  }
                  MVar9 = rc_hal_start(pMVar3->rc_ctx,&local_2c0.rc);
                  if (MVar9 == MPP_OK) {
                    if ((mpp_enc_debug & 0x20) != 0) {
                      _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","try_proc_low_deley_task",
                                 local_2c0.rc.frm.val >> 0x30);
                    }
                    MVar9 = mpp_enc_hal_gen_regs(hal,&local_2c0.task);
                    if (MVar9 == MPP_OK) {
                      local_2c0.task.part_first = 0;
                      local_2c0.task.part_last = 0;
                      do {
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal start\n","try_proc_low_deley_task",
                                     local_2c0.rc.frm.val >> 0x30);
                        }
                        MVar9 = mpp_enc_hal_part_start(hal,&local_2c0.task);
                        if (MVar9 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar9);
                          pcVar17 = "mpp %p mpp_enc_hal_part_start:%-4d failed return %d";
                          uVar21 = 0x924;
                          goto LAB_0013ff7d;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal wait\n","try_proc_low_deley_task",
                                     local_2c0.rc.frm.val >> 0x30);
                        }
                        MVar9 = mpp_enc_hal_part_wait(hal,&local_2c0.task);
                        if (MVar9 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar9);
                          pcVar17 = "mpp %p mpp_enc_hal_part_wait:%-4d failed return %d";
                          uVar21 = 0x927;
                          goto LAB_0013ff7d;
                        }
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","try_proc_low_deley_task",
                                     local_2c0.rc.frm.val >> 0x30);
                        }
                        MVar9 = mpp_enc_hal_ret_task(hal,&local_2c0.task);
                        if (MVar9 != MPP_OK) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                MVar9);
                          pcVar17 = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                          uVar21 = 0x92a;
                          goto LAB_0013ff7d;
                        }
                        if (local_2c0.task.part_first != 0) {
                          local_2c0.task.part_pos = (RK_U8 *)mpp_packet_get_pos(pvVar20);
                          local_2c0.task.part_length = 0;
                        }
                        mpp_packet_set_length(pvVar20,(ulong)local_2c0.task.length);
                        if ((mpp_enc_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_enc","task %d task_out %p\n","try_proc_low_deley_task",
                                     local_2c0.rc.frm.val >> 0x30,pMVar3->task_out);
                        }
LAB_001402f0:
                        if (pMVar3->task_out == (MppTask)0x0) {
                          if ((mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task %d poll new task for part output\n",
                                       "try_proc_low_deley_task",local_2c0.rc.frm.val >> 0x30);
                          }
                          MVar9 = _mpp_port_poll("try_proc_low_deley_task",pMVar3->output,
                                                 MPP_POLL_NON_BLOCK);
                          if (MVar9 < MPP_OK) {
                            local_314 = local_314 | 8;
                            local_2c0.status.val = local_2c0.status.val | 0x400;
                            goto LAB_0013d80f;
                          }
                          local_2c0.status.val = local_2c0.status.val | 4;
                          local_314 = local_314 & 0xfff7;
                          if ((mpp_enc_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_enc","task out ready\n","try_proc_low_deley_task");
                          }
                          _mpp_port_dequeue("try_proc_low_deley_task",pMVar3->output,
                                            &pMVar3->task_out);
                          if (pMVar3->task_out == (MppTask)0x0) {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  0x947);
                            _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                                       "enc->task_out","try_proc_low_deley_task",
                                       in_stack_fffffffffffffcb8);
                            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
                          }
                        }
                        if (local_2c0.task.part_last != 0) break;
                        pvVar14 = mpp_packet_get_pos(pvVar20);
                        pRVar6 = local_2c0.task.part_pos;
                        autolock.mEnabled = 0;
                        autolock._4_4_ = 0;
                        uVar18 = (ulong)local_2c0.task.length;
                        if ((mpp_enc_debug & 0x20) != 0) {
                          in_stack_fffffffffffffcc0 =
                               CONCAT44((int)(in_stack_fffffffffffffcc0 >> 0x20),
                                        local_2c0.task.length);
                          in_stack_fffffffffffffcb8 = pvVar14;
                          _mpp_log_l(4,"mpp_enc","pkt %d last %p part %p len %d\n",
                                     "try_proc_low_deley_task",(ulong)local_2c0.task.part_count,
                                     local_2c0.task.part_pos,pvVar14,in_stack_fffffffffffffcc0);
                        }
                        pRVar24 = (RK_U8 *)((long)pvVar14 + uVar18);
                        mpp_packet_copy_init((MppPacket *)&autolock,pvVar20);
                        *(RK_U8 **)(autolock._0_8_ + 0x10) = pRVar6;
                        *(ulong *)(autolock._0_8_ + 0x20) =
                             (long)pRVar24 - (long)pRVar6 & 0xffffffff;
                        *(undefined4 *)(autolock._0_8_ + 0x38) = 0x10;
                        bVar15 = ((byte)local_2c0.task.part_first & 1) << 5 | 0x10;
                        *(byte *)(autolock._0_8_ + 0x38) = bVar15;
                        *(byte *)(autolock._0_8_ + 0x38) =
                             ((byte)local_2c0.task.part_last & 1) << 6 | bVar15;
                        if ((mpp_enc_debug & 0x20) != 0) {
                          in_stack_fffffffffffffcb8 =
                               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                (int)((long)pRVar24 - (long)pRVar6));
                          _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n",
                                     "try_proc_low_deley_task",(ulong)local_2c0.task.part_count,
                                     pRVar6,in_stack_fffffffffffffcb8);
                          if ((mpp_enc_debug & 0x20) != 0) {
                            in_stack_fffffffffffffcb8 =
                                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                                  local_2c0.task.part_count);
                            local_2c0.task.part_pos = pRVar24;
                            _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld part %d\n",
                                       "try_proc_low_deley_task",local_2c0.rc.frm.val >> 0x30,
                                       pMVar3->task_pts,in_stack_fffffffffffffcb8);
                            pRVar24 = local_2c0.task.part_pos;
                          }
                        }
                        local_2c0.task.part_pos = pRVar24;
                        mpp_task_meta_set_packet
                                  (pMVar3->task_out,KEY_OUTPUT_PACKET,(MppPacket)autolock._0_8_);
                        _mpp_port_enqueue("try_proc_low_deley_task",pMVar3->output,pMVar3->task_out)
                        ;
                        pMVar3->task_out = (MppTask)0x0;
                        local_2c0.task.part_count = local_2c0.task.part_count + 1;
                        hal = local_80;
                      } while (local_2c0.task.part_last == 0);
                      goto LAB_0013ff89;
                    }
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
                    uVar21 = 0x91d;
                  }
                  else {
                    in_stack_fffffffffffffcb8 =
                         (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                    pcVar17 = "mpp %p rc_hal_start:%-4d failed return %d";
                    uVar21 = 0x91a;
                  }
                }
                else {
                  in_stack_fffffffffffffcb8 =
                       (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                  pcVar17 = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
                  uVar21 = 0x917;
                }
              }
              else {
                in_stack_fffffffffffffcb8 =
                     (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
                pcVar17 = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
                uVar21 = 0x914;
              }
            }
            else {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
              pcVar17 = "mpp %p rc_frm_start:%-4d failed return %d";
              uVar21 = 0x90e;
            }
          }
          else {
            in_stack_fffffffffffffcb8 =
                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
            pcVar17 = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
            uVar21 = 0x90b;
          }
LAB_0013ff7d:
          _mpp_log_l(2,"mpp_enc",pcVar17,(char *)0x0,data,uVar21,in_stack_fffffffffffffcb8);
        }
LAB_0013ff89:
        while( true ) {
          pvVar14 = mpp_packet_get_pos(pvVar20);
          pRVar6 = local_2c0.task.part_pos;
          uVar18 = (ulong)local_2c0.task.length;
          if ((mpp_enc_debug & 0x20) == 0) {
            uVar23 = (long)pvVar14 + (uVar18 - (long)local_2c0.task.part_pos);
            bVar26 = true;
          }
          else {
            in_stack_fffffffffffffcb8 = pvVar14;
            in_stack_fffffffffffffcc0 = uVar18;
            _mpp_log_l(4,"mpp_enc","pkt %d last %p part %p len %d\n","try_proc_low_deley_task",
                       (ulong)local_2c0.task.part_count,local_2c0.task.part_pos,pvVar14,uVar18);
            uVar23 = (long)pvVar14 + (uVar18 - (long)pRVar6);
            bVar26 = true;
            if ((mpp_enc_debug & 0x20) != 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(int)uVar23);
              _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n","try_proc_low_deley_task",
                         (ulong)local_2c0.task.part_count,pRVar6,in_stack_fffffffffffffcb8,
                         in_stack_fffffffffffffcc0);
              bVar26 = (mpp_enc_debug & 0x20) == 0;
            }
          }
          pRVar24 = (RK_U8 *)((long)pvVar14 + uVar18);
          *(ulong *)((long)pvVar20 + 0x20) = uVar23 & 0xffffffff;
          *(RK_U8 **)((long)pvVar20 + 0x10) = pRVar6;
          *(undefined4 *)((long)pvVar20 + 0x38) = 0x10;
          bVar15 = ((byte)local_2c0.task.part_first & 1) << 5 | 0x10;
          *(byte *)((long)pvVar20 + 0x38) = bVar15;
          *(byte *)((long)pvVar20 + 0x38) = ((byte)local_2c0.task.part_last & 1) << 6 | bVar15;
          if (!bVar26) {
            in_stack_fffffffffffffcb8 =
                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(int)uVar23);
            _mpp_log_l(4,"mpp_enc","pkt %d new pos %p len %d\n","try_proc_low_deley_task",
                       (ulong)local_2c0.task.part_count,pRVar6,in_stack_fffffffffffffcb8);
            if ((mpp_enc_debug & 0x20) != 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                    local_2c0.task.part_count);
              local_2c0.task.part_pos = pRVar24;
              _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld part %d\n",
                         "try_proc_low_deley_task",local_2c0.rc.frm.val >> 0x30,pMVar3->task_pts,
                         in_stack_fffffffffffffcb8);
              pRVar24 = local_2c0.task.part_pos;
            }
          }
          local_2c0.task.part_pos = pRVar24;
          mpp_task_meta_set_packet(pMVar3->task_out,KEY_OUTPUT_PACKET,pvVar20);
          _mpp_port_enqueue("try_proc_low_deley_task",pMVar3->output,pMVar3->task_out);
          pMVar3->task_out = (MppTask)0x0;
          local_2c0.task.part_count = 0;
          local_2c0.status.val = local_2c0.status.val & 0xfffffbff;
          RVar11 = mpp_time();
          pMVar3->time_end = RVar11;
          pMVar3->frame_count = pMVar3->frame_count + 1;
          if ((((pMVar3->dev != (MppDev)0x0) && (pMVar3->time_base != 0)) && (RVar11 != 0)) &&
             (999999 < RVar11 - pMVar3->time_base)) {
            update_hal_info_fps(pMVar3);
          }
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d rc hal end\n","try_proc_low_deley_task",
                       local_2c0.rc.frm.val >> 0x30);
          }
          MVar9 = rc_hal_end(pMVar3->rc_ctx,&local_2c0.rc);
          if (MVar9 == MPP_OK) break;
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
          _mpp_log_l(2,"mpp_enc","mpp %p rc_hal_end:%-4d failed return %d",(char *)0x0,data,0x99c,
                     in_stack_fffffffffffffcb8);
        }
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","try_proc_low_deley_task",
                     local_2c0.rc.frm.val >> 0x30,pMVar3->task_pts);
        }
        mpp_task_meta_set_frame(pMVar3->task_in,KEY_INPUT_FRAME,pMVar3->frame);
        _mpp_port_enqueue("try_proc_low_deley_task",pMVar3->input,pMVar3->task_in);
        pMVar3->task_in = (MppTask)0x0;
        pMVar3->task_out = (MppTask)0x0;
        pMVar3->frame = (MppFrame)0x0;
        pMVar3->packet = (MppPacket)0x0;
        pMVar3->frm_buf = (MppBuffer)0x0;
        pMVar3->pkt_buf = (MppBuffer)0x0;
        (pMVar3->hdr_status).val = *(byte *)&pMVar3->hdr_status & 1;
        local_2c0.status.val = 0;
        local_2c0.usr.force_flag = 0;
      }
      goto LAB_0013d80f;
    }
    if (enc->cmd_send == enc->cmd_recv) {
      if (enc->reset_flag != 0) {
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","thread reset start\n","mpp_enc_thread");
        }
        autolock.mEnabled = 1;
        autolock.mLock = (Mutex *)&local_78->__data;
        pthread_mutex_lock(local_78);
        enc->status_flag = 0;
        Mutex::Autolock::~Autolock(&autolock);
        *(byte *)&(enc->frm_cfg).force_flag = (byte)(enc->frm_cfg).force_flag | 1;
        pRVar2 = &(enc->frm_cfg).force_idr;
        *pRVar2 = *pRVar2 + 1;
        autolock.mEnabled = 1;
        autolock.mLock = (Mutex *)&local_48->__data;
        pthread_mutex_lock(local_48);
        enc->reset_flag = 0;
        sem_post(local_50);
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_thread");
        }
        Mutex::Autolock::~Autolock(&autolock);
        local_314 = 0;
        goto LAB_0013d80f;
      }
      MVar9 = MPP_OK;
      if ((local_2c0.status.val & 2) == 0) {
        MVar9 = _mpp_port_poll("try_get_enc_task",enc->input,MPP_POLL_NON_BLOCK);
        if (MVar9 < MPP_OK) {
          local_314 = local_314 | 1;
          goto LAB_0013d80f;
        }
        local_2c0.status.val = local_2c0.status.val | 2;
        local_314 = local_314 & 0xfffe;
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task in ready\n","try_get_enc_task");
        }
      }
      if ((local_2c0.status.val & 4) == 0) {
        MVar9 = _mpp_port_poll("try_get_enc_task",enc->output,MPP_POLL_NON_BLOCK);
        if (MVar9 < MPP_OK) {
          local_314 = local_314 | 8;
          goto LAB_0013d80f;
        }
        local_2c0.status.val = local_2c0.status.val | 4;
        local_314 = local_314 & 0xfff7;
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task out ready\n","try_get_enc_task");
        }
      }
      if ((local_2c0.status.val & 8) == 0) {
        _mpp_port_dequeue("try_get_enc_task",enc->input,task);
        if (enc->task_in == (MppTask)0x0) {
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x85b);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->task_in",
                     "try_get_enc_task",in_stack_fffffffffffffcb8);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
        }
        MVar9 = _mpp_port_dequeue("try_get_enc_task",enc->output,local_60);
        if (enc->task_out == (MppTask)0x0) {
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x85e);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->task_out",
                     "try_get_enc_task",in_stack_fffffffffffffcb8);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
        }
        mpp_task_meta_get_frame(*task,KEY_INPUT_FRAME,frame);
        mpp_task_meta_get_packet(*task,KEY_OUTPUT_PACKET,packet);
        mpp_task_meta_get_buffer(*task,KEY_MOTION_INFO,local_68);
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task dequeue done frm %p pkt %p\n","try_get_enc_task",*frame,
                     *packet);
        }
        stopwatch = mpp_frame_get_stopwatch(*frame);
        mpp_stopwatch_record(stopwatch,"encode task start");
        *ppvVar1 = (MppBuffer)0x0;
        enc->pkt_buf = (MppBuffer)0x0;
        if (*packet == (MppPacket)0x0) {
          mpp_packet_new(packet);
        }
        else {
          pvVar12 = mpp_packet_get_buffer(*packet);
          enc->pkt_buf = pvVar12;
        }
        if (*frame != (MppFrame)0x0) {
          RVar11 = mpp_frame_get_pts(*frame);
          pvVar12 = mpp_frame_get_buffer(enc->frame);
          enc->task_pts = RVar11;
          enc->frm_buf = pvVar12;
          mpp_packet_set_pts(enc->packet,RVar11);
          pvVar20 = enc->packet;
          RVar11 = mpp_frame_get_dts(enc->frame);
          mpp_packet_set_dts(pvVar20,RVar11);
          RVar10 = mpp_frame_get_eos(enc->frame);
          if (RVar10 == 0) {
            mpp_packet_clr_eos(enc->packet);
          }
          else {
            mpp_packet_set_eos(enc->packet);
          }
          if ((*frame != (MppFrame)0x0) && (*ppvVar1 != (MppBuffer)0x0)) {
            local_2c0.status.val = local_2c0.status.val | 8;
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task frame packet ready\n","try_get_enc_task");
            }
            goto LAB_0013dd3f;
          }
        }
        mpp_stopwatch_record(stopwatch,"invalid on check frm pkt");
        memset(&local_2c0.task,0,0xb8);
      }
      else {
        stopwatch = (MppStopwatch)0x0;
LAB_0013dd3f:
        EVar22 = local_2c0.status;
        uVar19 = local_2c0.seq_idx;
        if ((local_2c0.status.val & 0x10) == 0) {
          memset(&local_2c0.task,0,0x208);
          local_2c0.usr.force_flag = local_70->force_flag;
          local_2c0.usr.force_idr = local_70->force_idr;
          local_2c0.usr.force_pskip = local_70->force_pskip;
          local_2c0.usr.force_nonref = local_70->force_nonref;
          local_2c0.usr.force_lt_idx = local_70->force_lt_idx;
          local_2c0.usr.force_temporal_id = local_70->force_temporal_id;
          local_2c0.usr.force_ref_mode = local_70->force_ref_mode;
          local_2c0.usr.force_ref_arg = local_70->force_ref_arg;
          (enc->frm_cfg).force_flag = 0;
          local_2c0.task.rc_task = &local_2c0.rc;
          local_2c0.task.frame = enc->frame;
          local_2c0.task.input = enc->frm_buf;
          local_2c0.task.packet = enc->packet;
          local_2c0.task.output = enc->pkt_buf;
          local_2c0.task.md_info = enc->md_info;
          local_2c0.rc.frm.val = (ulong)(uint)local_2c0.seq_idx << 0x30;
          local_2c0.rc.frame = enc->frame;
          uVar19 = local_2c0.seq_idx + 1U;
          local_2c0.task.frm_cfg = cfg;
          local_2c0.task.stopwatch = stopwatch;
          if ((mpp_enc_debug & 0x20) != 0) {
            uVar7 = (ushort)local_2c0.seq_idx;
            local_2c0.seq_idx = local_2c0.seq_idx + 1U;
            _mpp_log_l(4,"mpp_enc","task seq idx %d start\n","try_get_enc_task",(ulong)uVar7);
            EVar22 = local_2c0.status;
            uVar19 = local_2c0.seq_idx;
          }
        }
        local_2c0.seq_idx = uVar19;
        if ((EVar22.val & 0x20) == 0) {
          MVar9 = rc_frm_check_drop(enc->rc_ctx,&local_2c0.rc);
          if (MVar9 != MPP_OK) {
            in_stack_fffffffffffffcb8 =
                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
            _mpp_log_l(2,"mpp_enc","mpp %p rc_frm_check_drop:%-4d failed return %d",(char *)0x0,
                       enc->mpp,0x88f,in_stack_fffffffffffffcb8);
            goto LAB_0013e5c8;
          }
          local_2c0.status.val = local_2c0.status.val | 0x20;
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d drop %d\n","try_get_enc_task",
                       local_2c0.rc.frm.val >> 0x30,
                       (ulong)((uint)((ulong)local_2c0.rc.frm >> 0x20) & 1));
          }
          local_2c0.task.valid = 1;
          MVar9 = MPP_OK;
          if ((local_2c0.rc.frm.val & 0x100000000) != 0) {
            mpp_stopwatch_record(stopwatch,"invalid on frame rate drop");
            local_2c0.task.length = 0;
            local_2c0.task.flags.drop_by_fps = 1;
            EVar22.val = local_2c0.status.val | 0x100;
            uVar19 = local_2c0.status.val >> 9;
            local_2c0.status.val = EVar22.val;
            if ((uVar19 & 1) == 0) {
              if (local_2c0.usr.force_flag != 0) {
                mpp_enc_refs_set_usr_cfg(enc->refs,cfg);
              }
              local_2c0.status.val = local_2c0.status.val | 0x200;
            }
            goto LAB_0013e6d5;
          }
        }
        else if (local_2c0.task.valid == 0) {
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8a6);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"hal_task->valid",
                     "try_get_enc_task",in_stack_fffffffffffffcb8);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
        }
        if ((local_2c0.status.val & 0x80) == 0) {
          pvVar12 = enc->pkt_buf;
          if (pvVar12 == (MppBuffer)0x0) {
            uVar16 = ((enc->cfg).prep.height + 0xfU & 0xffffff0) *
                     ((enc->cfg).prep.width + 0xfU & 0xfffffff0);
            pvVar14 = enc->mpp;
            uVar19 = uVar16 * 3 >> 1;
            if (enc->coding != MPP_VIDEO_CodingMJPEG) {
              uVar19 = uVar16;
            }
            pvVar20 = enc->packet;
            autolock.mEnabled = 0;
            autolock._4_4_ = 0;
            if (uVar19 == 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x611);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"size",
                         "mpp_enc_check_pkt_buf",in_stack_fffffffffffffcb8);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
            }
            mpp_buffer_get_with_tag
                      (*(MppBufferGroup *)((long)pvVar14 + 0x38),(MppBuffer *)&autolock,
                       (ulong)uVar19,"mpp_enc","mpp_enc_check_pkt_buf");
            mpp_buffer_attach_dev_f("mpp_enc_check_pkt_buf",(MppBuffer)autolock._0_8_,enc->dev);
            if (autolock._0_8_ == 0) {
              in_stack_fffffffffffffcb8 =
                   (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x614);
              _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"buffer",
                         "mpp_enc_check_pkt_buf",in_stack_fffffffffffffcb8);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
            }
            enc->pkt_buf = (MppBuffer)autolock._0_8_;
            pvVar14 = mpp_buffer_get_ptr_with_caller
                                ((MppBuffer)autolock._0_8_,"mpp_enc_check_pkt_buf");
            *(void **)((long)pvVar20 + 8) = pvVar14;
            *(void **)((long)pvVar20 + 0x10) = pvVar14;
            sVar13 = mpp_buffer_get_size_with_caller
                               ((MppBuffer)autolock._0_8_,"mpp_enc_check_pkt_buf");
            *(size_t *)((long)pvVar20 + 0x18) = sVar13;
            *(undefined8 *)((long)pvVar20 + 0x20) = 0;
            *(undefined8 *)((long)pvVar20 + 0x40) = autolock._0_8_;
            if ((mpp_enc_debug & 0x20) != 0) {
              pvVar20 = *packet;
              pcVar17 = "create output pkt %p buf %p\n";
              pvVar12 = (MppBuffer)autolock._0_8_;
              goto LAB_0013e323;
            }
          }
          else if ((mpp_enc_debug & 0x20) != 0) {
            pvVar20 = *packet;
            in_stack_fffffffffffffcb8 = mpp_packet_get_pos(pvVar20);
            in_stack_fffffffffffffcc0 = mpp_packet_get_length(*packet);
            pcVar17 = "output to pkt %p buf %p pos %p length %d\n";
LAB_0013e323:
            _mpp_log_l(4,"mpp_enc",pcVar17,"mpp_enc_check_pkt_buf",pvVar20,pvVar12);
          }
          local_2c0.status.val = local_2c0.status.val | 0x80;
          local_2c0.task.output = enc->pkt_buf;
        }
        if (*packet == (MppPacket)0x0) {
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8af);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->packet",
                     "try_get_enc_task",in_stack_fffffffffffffcb8);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
        }
        if (enc->pkt_buf == (MppBuffer)0x0) {
          in_stack_fffffffffffffcb8 =
               (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),0x8b0);
          _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->pkt_buf",
                     "try_get_enc_task",in_stack_fffffffffffffcb8);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00140587;
        }
        if (enc->hal_info_updated == 0) {
          update_enc_hal_info(enc);
          enc->hal_info_updated = 1;
        }
        if (((uint)enc->hdr_status & 1) == 0) {
          enc_impl_gen_hdr(enc->impl,enc->hdr_pkt);
          sVar13 = mpp_packet_get_length(enc->hdr_pkt);
          enc->hdr_len = (RK_U32)sVar13;
          *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 1;
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d update header length %d\n","try_get_enc_task",
                       local_2c0.rc.frm.val >> 0x30,sVar13 & 0xffffffff);
          }
          mpp_packet_append(enc->packet,enc->hdr_pkt);
          local_2c0.task.header_length = enc->hdr_len;
          local_2c0.task.length = local_2c0.task.length + local_2c0.task.header_length;
          *(byte *)&enc->hdr_status = *(byte *)&enc->hdr_status | 8;
        }
        check_hal_task_pkt_len(&local_2c0.task,"gen_hdr and adding");
        if ((local_2c0.status.val >> 8 & 1) == 0) {
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d enc start\n","try_get_enc_task",
                       local_2c0.rc.frm.val >> 0x30);
          }
          MVar9 = enc_impl_start(enc->impl,&local_2c0.task);
          if (MVar9 != MPP_OK) {
            in_stack_fffffffffffffcb8 =
                 (void *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),MVar9);
            _mpp_log_l(2,"mpp_enc","mpp %p enc_impl_start:%-4d failed return %d",(char *)0x0,
                       enc->mpp,0x8cd,in_stack_fffffffffffffcb8);
            goto LAB_0013e5c8;
          }
          local_2c0.status.val = local_2c0.status.val | 0x100;
          MVar9 = MPP_OK;
        }
        if ((local_2c0.status.val >> 9 & 1) == 0) {
          if (local_2c0.usr.force_flag != 0) {
            mpp_enc_refs_set_usr_cfg(enc->refs,cfg);
          }
          local_2c0.status.val = local_2c0.status.val | 0x200;
        }
        if ((local_2c0.status.val >> 0xb & 1) == 0) {
          mpp_enc_refs_stash(enc->refs);
          local_2c0.status.val = local_2c0.status.val | 0x800;
        }
        if (MVar9 == MPP_OK) goto LAB_0013e6d5;
      }
LAB_0013e5c8:
      mpp_stopwatch_record(local_2c0.task.stopwatch,"encode task done");
      if (*packet != (MppPacket)0x0) {
        mpp_packet_set_length(*packet,(ulong)local_2c0.task.length);
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d enqueue packet pts %lld\n","mpp_enc_terminate_task",
                     local_2c0.rc.frm.val >> 0x30,enc->task_pts);
        }
        mpp_task_meta_set_packet(enc->task_out,KEY_OUTPUT_PACKET,enc->packet);
        _mpp_port_enqueue("mpp_enc_terminate_task",enc->output,enc->task_out);
      }
      task_00 = *task;
      if (task_00 != (MppTask)0x0) {
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d enqueue frame pts %lld\n","mpp_enc_terminate_task",
                     local_2c0.rc.frm.val >> 0x30,enc->task_pts);
          task_00 = enc->task_in;
        }
        mpp_task_meta_set_frame(task_00,KEY_INPUT_FRAME,enc->frame);
        _mpp_port_enqueue("mpp_enc_terminate_task",enc->input,enc->task_in);
      }
      goto LAB_0013f4cd;
    }
    if ((mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_thread",(ulong)enc->cmd_recv,
                 (ulong)enc->cmd);
    }
    sem_wait(local_38);
    MVar9 = mpp_enc_proc_cfg(enc,enc->cmd,enc->param);
    if (MVar9 != MPP_OK) {
      *enc->cmd_ret = MVar9;
    }
    uVar19 = enc->cmd_recv + 1;
    enc->cmd_recv = uVar19;
    if ((mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_thread",(ulong)uVar19,
                 (ulong)enc->cmd_send);
    }
    enc->param = (void *)0x0;
    enc->cmd = 0;
    sem_post(local_40);
    mpp_enc_hal_prepare(enc->enc_hal);
    mpp_enc_proc_rc_update(enc);
    local_314 = 0;
  } while( true );
}

Assistant:

void *mpp_enc_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc  = enc->thread_enc;
    EncAsyncTaskInfo task;
    EncAsyncWait wait;
    EncAsyncStatus *status = &task.status;
    MPP_RET ret = MPP_OK;

    memset(&task, 0, sizeof(task));
    wait.val = 0;

    enc->time_base = mpp_time();

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_task_wait(enc, &wait))
                thd_enc->wait();
        }

        // When encoder is not on encoding process external config and reset
        if (!status->enc_start) {
            // 1. process user control
            if (enc->cmd_send != enc->cmd_recv) {
                enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                wait.val = 0;
                continue;
            }

            // 2. process reset
            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");
                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
                wait.val = 0;
                continue;
            }

            // 3. try get a task to encode
            ret = try_get_enc_task(enc, &task, &wait);
            if (ret)
                continue;
        }

        mpp_assert(status->enc_start);
        if (!status->enc_start)
            continue;

        // check partition low delay encoding
        /*
         * NOTE: Only when both split encoding and low delay mode are set then
         *       use special low delay path
         */
        if (enc->low_delay_part_mode)
            try_proc_low_deley_task(mpp, &task, &wait);
        else
            try_proc_normal_task(enc, &task);
    }

    // clear remain task in enc->output port
    release_task_in_port(enc->input);
    release_task_in_port(mpp->mUsrOutPort);

    return NULL;
}